

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomProperty::write(DomProperty *this,int __fd,void *__buf,size_t __n)

{
  DomColor *this_00;
  DomFont *this_01;
  DomResourceIcon *this_02;
  DomResourcePixmap *this_03;
  DomPalette *this_04;
  DomPoint *this_05;
  DomRect *this_06;
  DomLocale *this_07;
  DomSizePolicy *this_08;
  DomSize *this_09;
  DomString *this_10;
  DomStringList *this_11;
  DomDate *this_12;
  DomTime *this_13;
  DomDateTime *this_14;
  DomPointF *this_15;
  DomRectF *this_16;
  DomSizeF *this_17;
  DomChar *this_18;
  DomUrl *this_19;
  bool bVar1;
  int iVar2;
  Kind KVar3;
  uint uVar4;
  qlonglong qVar5;
  qulonglong qVar6;
  uint *__n_00;
  undefined4 in_register_00000034;
  QAnyStringView *this_20;
  long in_FS_OFFSET;
  float fVar7;
  double dVar8;
  char16_t *str;
  DomProperty *in_stack_fffffffffffff748;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffff750;
  DomBrush *this_21;
  QString *in_stack_fffffffffffff758;
  QAnyStringView *in_stack_fffffffffffff760;
  char16_t *in_stack_fffffffffffff768;
  undefined1 local_6a0 [24];
  undefined1 local_688 [64];
  QAnyStringView *local_648;
  undefined1 local_638 [64];
  QAnyStringView *local_5f8;
  undefined1 local_5e8 [24];
  undefined1 local_5d0 [24];
  undefined1 local_5b8 [64];
  QAnyStringView *local_578;
  undefined1 local_568 [24];
  undefined1 local_550 [24];
  undefined1 local_538 [24];
  undefined1 local_520 [24];
  undefined1 local_508 [24];
  undefined1 local_4f0 [24];
  undefined1 local_4d8 [64];
  QAnyStringView *local_498;
  undefined1 local_488 [64];
  QAnyStringView *local_448;
  undefined1 local_438 [64];
  QAnyStringView *local_3f8;
  undefined1 local_3e8 [24];
  undefined1 local_3d0 [24];
  undefined1 local_3b8 [24];
  undefined1 local_3a0 [24];
  undefined1 local_388 [88];
  QAnyStringView *local_330;
  undefined1 local_320 [24];
  undefined1 local_308 [24];
  undefined1 local_2f0 [24];
  undefined1 local_2d8 [24];
  undefined1 local_2c0 [24];
  undefined1 local_2a8 [88];
  QAnyStringView *local_250;
  QAnyStringView *local_200;
  undefined1 local_1f0 [64];
  QAnyStringView *local_1b0;
  QAnyStringView *local_160;
  undefined1 local_150 [88];
  QAnyStringView *local_f8;
  undefined1 local_e8 [64];
  QAnyStringView *local_a8;
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  this_20 = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1a8561);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"property",8);
    QString::QString((QString *)in_stack_fffffffffffff750,(DataPointer *)in_stack_fffffffffffff748);
  }
  else {
    QString::toLower(&in_stack_fffffffffffff748->m_attr_name);
  }
  QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)this_20);
  QString::~QString((QString *)0x1a862f);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffff750);
  }
  bVar1 = hasAttributeName(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    attributeName(in_stack_fffffffffffff748);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)this_20,local_58);
    QString::~QString((QString *)0x1a8700);
    QString::~QString((QString *)0x1a870d);
  }
  bVar1 = hasAttributeStdset(this);
  if (bVar1) {
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    iVar2 = attributeStdset(this);
    QString::number((int)local_e8,iVar2);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)this_20,local_a8);
    QString::~QString((QString *)0x1a87d1);
    QString::~QString((QString *)0x1a87de);
  }
  KVar3 = kind(this);
  __n_00 = &switchD_001a8816::switchdataD_001f7350;
  switch(KVar3) {
  case Bool:
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    elementBool(in_stack_fffffffffffff748);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)this_20,local_f8);
    QString::~QString((QString *)0x1a88bb);
    QString::~QString((QString *)0x1a88c8);
    break;
  case Color:
    if (this->m_color != (DomColor *)0x0) {
      this_00 = this->m_color;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomColor::write(this_00,__fd,local_150,(size_t)__n_00);
      QString::~QString((QString *)0x1a8943);
    }
    break;
  case Cstring:
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    elementCstring(in_stack_fffffffffffff748);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)this_20,local_160);
    QString::~QString((QString *)0x1a89ea);
    QString::~QString((QString *)0x1a89f7);
    break;
  case Cursor:
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    iVar2 = elementCursor(this);
    QString::number((int)local_1f0,iVar2);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)this_20,local_1b0);
    QString::~QString((QString *)0x1a8aaa);
    QString::~QString((QString *)0x1a8ab7);
    break;
  case CursorShape:
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    elementCursorShape(in_stack_fffffffffffff748);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)this_20,local_200);
    QString::~QString((QString *)0x1a8b5e);
    QString::~QString((QString *)0x1a8b6b);
    break;
  case Enum:
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    elementEnum(in_stack_fffffffffffff748);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)this_20,local_250);
    QString::~QString((QString *)0x1a8c12);
    QString::~QString((QString *)0x1a8c1f);
    break;
  case Font:
    if (this->m_font != (DomFont *)0x0) {
      this_01 = this->m_font;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomFont::write(this_01,__fd,local_2a8,(size_t)__n_00);
      QString::~QString((QString *)0x1a8ca0);
    }
    break;
  case IconSet:
    if (this->m_iconSet != (DomResourceIcon *)0x0) {
      this_02 = this->m_iconSet;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomResourceIcon::write(this_02,__fd,local_2c0,(size_t)__n_00);
      QString::~QString((QString *)0x1a8d21);
    }
    break;
  case Pixmap:
    if (this->m_pixmap != (DomResourcePixmap *)0x0) {
      this_03 = this->m_pixmap;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomResourcePixmap::write(this_03,__fd,local_2d8,(size_t)__n_00);
      QString::~QString((QString *)0x1a8da2);
    }
    break;
  case Palette:
    if (this->m_palette != (DomPalette *)0x0) {
      this_04 = this->m_palette;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomPalette::write(this_04,__fd,local_2f0,(size_t)__n_00);
      QString::~QString((QString *)0x1a8e23);
    }
    break;
  case Point:
    if (this->m_point != (DomPoint *)0x0) {
      this_05 = this->m_point;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomPoint::write(this_05,__fd,local_308,(size_t)__n_00);
      QString::~QString((QString *)0x1a8ea4);
    }
    break;
  case Rect:
    if (this->m_rect != (DomRect *)0x0) {
      this_06 = this->m_rect;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomRect::write(this_06,__fd,local_320,(size_t)__n_00);
      QString::~QString((QString *)0x1a8f25);
    }
    break;
  case Set:
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    elementSet(in_stack_fffffffffffff748);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)this_20,local_330);
    QString::~QString((QString *)0x1a8fcc);
    QString::~QString((QString *)0x1a8fd9);
    break;
  case Locale:
    if (this->m_locale != (DomLocale *)0x0) {
      this_07 = this->m_locale;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomLocale::write(this_07,__fd,local_388,(size_t)__n_00);
      QString::~QString((QString *)0x1a905a);
    }
    break;
  case SizePolicy:
    if (this->m_sizePolicy != (DomSizePolicy *)0x0) {
      this_08 = this->m_sizePolicy;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomSizePolicy::write(this_08,__fd,local_3a0,(size_t)__n_00);
      QString::~QString((QString *)0x1a90db);
    }
    break;
  case Size:
    if (this->m_size != (DomSize *)0x0) {
      this_09 = this->m_size;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomSize::write(this_09,__fd,local_3b8,(size_t)__n_00);
      QString::~QString((QString *)0x1a915c);
    }
    break;
  case String:
    if (this->m_string != (DomString *)0x0) {
      this_10 = this->m_string;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomString::write(this_10,__fd,local_3d0,(size_t)__n_00);
      QString::~QString((QString *)0x1a91dd);
    }
    break;
  case StringList:
    if (this->m_stringList != (DomStringList *)0x0) {
      this_11 = this->m_stringList;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomStringList::write(this_11,__fd,local_3e8,(size_t)__n_00);
      QString::~QString((QString *)0x1a925e);
    }
    break;
  case Number:
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    iVar2 = elementNumber(this);
    QString::number((int)local_438,iVar2);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)this_20,local_3f8);
    QString::~QString((QString *)0x1a9311);
    QString::~QString((QString *)0x1a931e);
    break;
  case Float:
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    fVar7 = elementFloat(this);
    QString::number((double)fVar7,(char)local_488,0x66);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)this_20,local_448);
    QString::~QString((QString *)0x1a93d8);
    QString::~QString((QString *)0x1a93e5);
    break;
  case Double:
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    dVar8 = elementDouble(this);
    QString::number(dVar8,(char)local_4d8,0x66);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)this_20,local_498);
    QString::~QString((QString *)0x1a949b);
    QString::~QString((QString *)0x1a94a8);
    break;
  case Date:
    if (this->m_date != (DomDate *)0x0) {
      this_12 = this->m_date;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomDate::write(this_12,__fd,local_4f0,(size_t)__n_00);
      QString::~QString((QString *)0x1a9529);
    }
    break;
  case Time:
    if (this->m_time != (DomTime *)0x0) {
      this_13 = this->m_time;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomTime::write(this_13,__fd,local_508,(size_t)__n_00);
      QString::~QString((QString *)0x1a95aa);
    }
    break;
  case DateTime:
    if (this->m_dateTime != (DomDateTime *)0x0) {
      this_14 = this->m_dateTime;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomDateTime::write(this_14,__fd,local_520,(size_t)__n_00);
      QString::~QString((QString *)0x1a962b);
    }
    break;
  case PointF:
    if (this->m_pointF != (DomPointF *)0x0) {
      this_15 = this->m_pointF;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomPointF::write(this_15,__fd,local_538,(size_t)__n_00);
      QString::~QString((QString *)0x1a96a0);
    }
    break;
  case RectF:
    if (this->m_rectF != (DomRectF *)0x0) {
      this_16 = this->m_rectF;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomRectF::write(this_16,__fd,local_550,(size_t)__n_00);
      QString::~QString((QString *)0x1a9715);
    }
    break;
  case SizeF:
    if (this->m_sizeF != (DomSizeF *)0x0) {
      this_17 = this->m_sizeF;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomSizeF::write(this_17,__fd,local_568,(size_t)__n_00);
      QString::~QString((QString *)0x1a978a);
    }
    break;
  case LongLong:
    Qt::Literals::StringLiterals::operator____s
              (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    qVar5 = elementLongLong(this);
    QString::number((longlong)local_5b8,(int)qVar5);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)this_20,local_578);
    QString::~QString((QString *)0x1a9838);
    QString::~QString((QString *)0x1a9845);
    break;
  case Char:
    if (this->m_char != (DomChar *)0x0) {
      this_18 = this->m_char;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomChar::write(this_18,__fd,local_5d0,(size_t)__n_00);
      QString::~QString((QString *)0x1a98ba);
    }
    break;
  case Url:
    if (this->m_url != (DomUrl *)0x0) {
      this_19 = this->m_url;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomUrl::write(this_19,__fd,local_5e8,(size_t)__n_00);
      QString::~QString((QString *)0x1a992f);
    }
    break;
  case UInt:
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)this_20,(size_t)in_stack_fffffffffffff760);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    uVar4 = elementUInt(this);
    QString::number((uint)local_638,uVar4);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffff760,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)this_20,local_5f8);
    QString::~QString((QString *)0x1a99dc);
    QString::~QString((QString *)0x1a99e9);
    break;
  case ULongLong:
    Qt::Literals::StringLiterals::operator____s(in_stack_fffffffffffff768,(size_t)this_20);
    QAnyStringView::QAnyStringView(this_20,in_stack_fffffffffffff758);
    qVar6 = elementULongLong(this);
    QString::number((ulonglong)local_688,(int)qVar6);
    QAnyStringView::QAnyStringView(this_20,in_stack_fffffffffffff758);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)this_20,local_648);
    QString::~QString((QString *)0x1a9a97);
    QString::~QString((QString *)0x1a9aa4);
    break;
  case Brush:
    if (this->m_brush != (DomBrush *)0x0) {
      this_21 = this->m_brush;
      Qt::Literals::StringLiterals::operator____s
                (in_stack_fffffffffffff768,(size_t)in_stack_fffffffffffff760);
      DomBrush::write(this_21,(int)this_20,local_6a0,(size_t)__n_00);
      QString::~QString((QString *)0x1a9b16);
    }
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomProperty::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("property") : tagName.toLower());

    if (hasAttributeName())
        writer.writeAttribute(u"name"_s, attributeName());

    if (hasAttributeStdset())
        writer.writeAttribute(u"stdset"_s, QString::number(attributeStdset()));

    switch (kind()) {
    case Bool:
        writer.writeTextElement(u"bool"_s, elementBool());
        break;

    case Color:
        if (m_color != nullptr)
            m_color->write(writer, u"color"_s);
        break;

    case Cstring:
        writer.writeTextElement(u"cstring"_s, elementCstring());
        break;

    case Cursor:
        writer.writeTextElement(u"cursor"_s, QString::number(elementCursor()));
        break;

    case CursorShape:
        writer.writeTextElement(u"cursorShape"_s, elementCursorShape());
        break;

    case Enum:
        writer.writeTextElement(u"enum"_s, elementEnum());
        break;

    case Font:
        if (m_font != nullptr)
            m_font->write(writer, u"font"_s);
        break;

    case IconSet:
        if (m_iconSet != nullptr)
            m_iconSet->write(writer, u"iconset"_s);
        break;

    case Pixmap:
        if (m_pixmap != nullptr)
            m_pixmap->write(writer, u"pixmap"_s);
        break;

    case Palette:
        if (m_palette != nullptr)
            m_palette->write(writer, u"palette"_s);
        break;

    case Point:
        if (m_point != nullptr)
            m_point->write(writer, u"point"_s);
        break;

    case Rect:
        if (m_rect != nullptr)
            m_rect->write(writer, u"rect"_s);
        break;

    case Set:
        writer.writeTextElement(u"set"_s, elementSet());
        break;

    case Locale:
        if (m_locale != nullptr)
            m_locale->write(writer, u"locale"_s);
        break;

    case SizePolicy:
        if (m_sizePolicy != nullptr)
            m_sizePolicy->write(writer, u"sizepolicy"_s);
        break;

    case Size:
        if (m_size != nullptr)
            m_size->write(writer, u"size"_s);
        break;

    case String:
        if (m_string != nullptr)
            m_string->write(writer, u"string"_s);
        break;

    case StringList:
        if (m_stringList != nullptr)
            m_stringList->write(writer, u"stringlist"_s);
        break;

    case Number:
        writer.writeTextElement(u"number"_s, QString::number(elementNumber()));
        break;

    case Float:
        writer.writeTextElement(u"float"_s, QString::number(elementFloat(), 'f', 8));
        break;

    case Double:
        writer.writeTextElement(u"double"_s, QString::number(elementDouble(), 'f', 15));
        break;

    case Date:
        if (m_date != nullptr)
            m_date->write(writer, u"date"_s);
        break;

    case Time:
        if (m_time != nullptr)
            m_time->write(writer, u"time"_s);
        break;

    case DateTime:
        if (m_dateTime != nullptr)
            m_dateTime->write(writer, u"datetime"_s);
        break;

    case PointF:
        if (m_pointF != nullptr)
            m_pointF->write(writer, u"pointf"_s);
        break;

    case RectF:
        if (m_rectF != nullptr)
            m_rectF->write(writer, u"rectf"_s);
        break;

    case SizeF:
        if (m_sizeF != nullptr)
            m_sizeF->write(writer, u"sizef"_s);
        break;

    case LongLong:
        writer.writeTextElement(u"longLong"_s, QString::number(elementLongLong()));
        break;

    case Char:
        if (m_char != nullptr)
            m_char->write(writer, u"char"_s);
        break;

    case Url:
        if (m_url != nullptr)
            m_url->write(writer, u"url"_s);
        break;

    case UInt:
        writer.writeTextElement(u"UInt"_s, QString::number(elementUInt()));
        break;

    case ULongLong:
        writer.writeTextElement(u"uLongLong"_s, QString::number(elementULongLong()));
        break;

    case Brush:
        if (m_brush != nullptr)
            m_brush->write(writer, u"brush"_s);
        break;

    default:
        break;
    }
    writer.writeEndElement();
}